

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFObjectParser.cpp
# Opt level: O1

PDFObject * __thiscall
PDFObjectParser::ParseHexadecimalString(PDFObjectParser *this,string *inToken)

{
  PDFHexString *this_00;
  Trace *this_01;
  undefined8 uVar1;
  void *unaff_RBX;
  long lVar2;
  string local_80;
  string local_60;
  string local_40;
  
  lVar2 = inToken->_M_string_length - 1;
  if (inToken->_M_string_length != 0) {
    if ((inToken->_M_dataplus)._M_p[lVar2] == '>') {
      this_00 = (PDFHexString *)operator_new(0x68);
      std::__cxx11::string::substr((ulong)&local_60,(ulong)inToken);
      DecodeHexString(&local_40,this,&local_60);
      MaybeDecryptString(&local_80,this,&local_40);
      PDFHexString::PDFHexString(this_00,&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      this_01 = Trace::DefaultTrace();
      std::__cxx11::string::substr((ulong)&local_80,(ulong)inToken);
      Trace::TraceToLog(this_01,
                        "PDFObjectParser::ParseHexadecimalString, exception in parsing hexadecimal string, no closing angle, Expression: %s"
                        ,local_80._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      this_00 = (PDFHexString *)0x0;
    }
    return &this_00->super_PDFObject;
  }
  uVar1 = std::__throw_out_of_range_fmt
                    ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",lVar2,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  operator_delete(unaff_RBX,0x68);
  _Unwind_Resume(uVar1);
}

Assistant:

PDFObject* PDFObjectParser::ParseHexadecimalString(const std::string& inToken)
{
	// verify that last character is '>'
	if(inToken.at(inToken.size()-1) != scRightAngle)
	{
		TRACE_LOG1("PDFObjectParser::ParseHexadecimalString, exception in parsing hexadecimal string, no closing angle, Expression: %s",inToken.substr(0, MAX_TRACE_SIZE - 200).c_str());
		return NULL;
	}

	return new PDFHexString(MaybeDecryptString(DecodeHexString(inToken.substr(1, inToken.size() - 2))));
}